

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O2

void __thiscall duckdb::AsOfLocalState::~AsOfLocalState(AsOfLocalState *this)

{
  ~AsOfLocalState(this);
  operator_delete(this);
  return;
}

Assistant:

AsOfLocalState(ClientContext &context, const PhysicalAsOfJoin &op)
	    : context(context), allocator(Allocator::Get(context)), op(op), lhs_executor(context),
	      left_outer(IsLeftOuterJoin(op.join_type)), fetch_next_left(true) {
		lhs_keys.Initialize(allocator, op.join_key_types);
		for (const auto &cond : op.conditions) {
			lhs_executor.AddExpression(*cond.left);
		}

		lhs_payload.Initialize(allocator, op.children[0].get().GetTypes());
		lhs_sel.Initialize();
		left_outer.Initialize(STANDARD_VECTOR_SIZE);

		auto &gsink = op.sink_state->Cast<AsOfGlobalSinkState>();
		lhs_partition_sink = gsink.RegisterBuffer(context);
	}